

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_object_dotset_number(JSON_Object *object,char *name,double number)

{
  JSON_Status JVar1;
  JSON_Value *pJVar2;
  JSON_Value *in_XMM0_Qa;
  JSON_Value *value;
  char *in_stack_00000020;
  JSON_Object *in_stack_00000028;
  double in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  pJVar2 = json_value_init_number(in_stack_ffffffffffffffd8);
  if (pJVar2 == (JSON_Value *)0x0) {
    local_4 = -1;
  }
  else {
    JVar1 = json_object_dotset_value(in_stack_00000028,in_stack_00000020,(JSON_Value *)object);
    if (JVar1 == 0) {
      local_4 = 0;
    }
    else {
      json_value_free(in_XMM0_Qa);
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

JSON_Status json_object_dotset_number(JSON_Object *object, const char *name, double number) {
    JSON_Value *value = json_value_init_number(number);
    if (value == NULL) {
        return JSONFailure;
    }
    if (json_object_dotset_value(object, name, value) != JSONSuccess) {
        json_value_free(value);
        return JSONFailure;
    }
    return JSONSuccess;
}